

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluCountCofs4(word *pF,int nVars,int nBSsize,word (*pCofs) [256])

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  word iCofs [128];
  
  memset(iCofs,0,0x400);
  bVar1 = (byte)nBSsize & 0x1f;
  if (pCofs == (word (*) [256])0x0) {
    __assert_fail("pCofs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                  ,0x3d7,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  iVar8 = nVars - nBSsize;
  if ((iVar8 == 0 || nVars < nBSsize) || (4 < nBSsize - 2U)) {
    __assert_fail("nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                  ,0x3d8,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  if (5 < iVar8) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                  ,0x3f3,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  bVar2 = (byte)iVar8 & 0x1f;
  uVar7 = (ulong)(uint)(0 << bVar1);
  uVar4 = 0 << bVar2;
  uVar11 = 0;
  uVar12 = 0;
  do {
    if (uVar7 == (uint)(1 << bVar1)) {
      if (uVar4 - 3 < 2) {
        (*pCofs)[0] = iCofs[0];
        pCofs[1][0] = iCofs[1];
        pCofs[2][0] = iCofs[2];
        if (uVar4 == 4) {
          iCofs[2] = iCofs[3];
        }
        pCofs[3][0] = iCofs[2];
        pCofs[4][0] = uVar12;
        pCofs[5][0] = uVar11;
        return uVar4;
      }
      __assert_fail("nCofs >= 3 && nCofs <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                    ,0x3ea,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
    }
    bVar3 = (byte)iVar8 & 0x1f;
    uVar9 = (int)uVar7 << bVar3;
    uVar13 = pF[uVar9 >> 6] >> ((byte)uVar9 & 0x3f) & ~(-1L << ((byte)(1 << bVar2) & 0x3f));
    uVar10 = 0;
    if (0 < (int)uVar4) {
      uVar10 = (ulong)uVar4;
    }
    for (uVar5 = (ulong)(uint)(0 << bVar3); uVar10 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar13 == iCofs[uVar5]) {
        uVar10 = uVar5 & 0xffffffff;
        break;
      }
    }
    uVar9 = (uint)uVar10;
    if (uVar9 == uVar4) {
      lVar6 = (long)(int)uVar4;
      uVar4 = uVar4 + 1;
      iCofs[lVar6] = uVar13;
    }
    uVar13 = 1L << ((byte)uVar7 & 0x3f);
    uVar10 = 0;
    if ((uVar9 & 0x7ffffffd) == 1) {
      uVar10 = uVar13;
    }
    uVar12 = uVar12 | uVar10;
    if ((uVar9 & 0x7ffffffe) != 2) {
      uVar13 = 0;
    }
    uVar11 = uVar11 | uVar13;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int If_CluCountCofs4( word * pF, int nVars, int nBSsize, word pCofs[6][CLU_WRD_MAX/4] )
{
    word iCofs[128] = {0}, iCof, Result0 = 0, Result1 = 0;
    int nMints = (1 << nBSsize);
    int i, c, nCofs = 0;
    assert( pCofs );
    assert( nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars );
    if ( nVars - nBSsize < 6 )
    {
        int nShift = (1 << (nVars - nBSsize));
        word Mask  = ((((word)1) << nShift) - 1);
        for ( nCofs = i = 0; i < nMints; i++ )
        {
            iCof = (pF[(i * nShift) / 64] >> ((i * nShift) & 63)) & Mask;
            for ( c = 0; c < nCofs; c++ )
                if ( iCof == iCofs[c] )
                    break;
            if ( c == nCofs )
                iCofs[nCofs++] = iCof;
            if ( c == 1 || c == 3 )
                Result0 |= (((word)1) << i);
            if ( c == 2 || c == 3 )
                Result1 |= (((word)1) << i);
        }
        assert( nCofs >= 3 && nCofs <= 4 );
        pCofs[0][0] = iCofs[0];
        pCofs[1][0] = iCofs[1];
        pCofs[2][0] = iCofs[2];
        pCofs[3][0] = (nCofs == 4) ? iCofs[3] : iCofs[2];
        pCofs[4][0] = Result0;
        pCofs[5][0] = Result1;
    }
    else
        assert( 0 );
    return nCofs;
}